

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::source_funcname_formatter<spdlog::details::null_scoped_padder>::format
          (source_funcname_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,
          tm *param_3,memory_buf_t *dest)

{
  bool bVar1;
  memory_buf_t *in_RCX;
  long in_RSI;
  long in_RDI;
  null_scoped_padder p;
  size_t text_size;
  char *in_stack_ffffffffffffffa8;
  basic_string_view<char> *this_00;
  memory_buf_t *in_stack_ffffffffffffffc0;
  string_view_t in_stack_ffffffffffffffc8;
  
  bVar1 = source_loc::empty((source_loc *)(in_RSI + 0x38));
  if (!bVar1) {
    bVar1 = padding_info::enabled((padding_info *)(in_RDI + 8));
    if (bVar1) {
      this_00 = (basic_string_view<char> *)std::char_traits<char>::length((char_type *)0x20811d);
    }
    else {
      this_00 = (basic_string_view<char> *)0x0;
    }
    null_scoped_padder::null_scoped_padder
              ((null_scoped_padder *)&stack0xffffffffffffffd7,(size_t)this_00,
               (padding_info *)(in_RDI + 8),in_RCX);
    ::fmt::v6::basic_string_view<char>::basic_string_view(this_00,in_stack_ffffffffffffffa8);
    fmt_helper::append_string_view(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        if (msg.source.empty())
        {
            return;
        }
        size_t text_size = padinfo_.enabled() ? std::char_traits<char>::length(msg.source.funcname) : 0;
        ScopedPadder p(text_size, padinfo_, dest);
        fmt_helper::append_string_view(msg.source.funcname, dest);
    }